

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitio.cpp
# Opt level: O0

void __thiscall bitio::bitio_stream::seek(bitio_stream *this,int64_t n)

{
  uint64_t uVar1;
  char cVar2;
  ulong uVar3;
  int64_t al_offset;
  int64_t rbits;
  int64_t nbytes;
  int64_t nbits;
  int64_t n_local;
  bitio_stream *this_local;
  
  if (n != 0) {
    if (n < 1) {
      uVar3 = -n & 7;
      fseek((FILE *)this->file,((this->byte_index - (-n >> 3)) + -1) - this->current_buffer_length,1
           );
      load_buffer(this);
      this->byte_index = this->byte_index + 1;
      cVar2 = (char)uVar3;
      if ((long)(int)(8 - (uint)this->bit_count) < (long)uVar3) {
        uVar1 = this->byte_index;
        this->byte_index = uVar1 - 1;
        this->bit_buffer = this->byte_buffer[uVar1 - 1];
        this->bit_buffer = this->bit_buffer << (8 - this->bit_count & 0x1f);
        if (this->byte_index == 0) {
          fseek((FILE *)this->file,-1 - this->current_buffer_length,1);
          load_buffer(this);
          uVar1 = this->byte_index;
          this->byte_index = uVar1 + 1;
          this->bit_buffer = this->byte_buffer[uVar1];
          this->bit_buffer = this->bit_buffer << (8 - this->bit_count & 0x1f);
        }
        lim_skip(this,'\b' - cVar2);
      }
      else {
        this->bit_count = this->bit_count + cVar2;
        this->bit_buffer = this->byte_buffer[this->byte_index - 1];
        this->bit_buffer = this->bit_buffer << (8 - this->bit_count & 0x1f);
      }
    }
    else {
      skip(this,n);
    }
  }
  return;
}

Assistant:

void bitio_stream::seek(int64_t n) {
    if (n == 0) return;
    if (n > 0) {
        skip(n);
    } else {

        auto nbits = -n;
        auto nbytes = nbits >> 0x3;
        auto rbits = nbits & 0x7;

        int64_t al_offset = (int64_t) byte_index - (int64_t) nbytes - 1 - (int64_t) current_buffer_length;

        fseek(file, al_offset, SEEK_CUR);

        load_buffer();
        byte_index++;

        if (rbits <= 8 - bit_count) {
            bit_count += rbits;
            bit_buffer = byte_buffer[byte_index - 1];
            bit_buffer <<= 8 - bit_count;
        } else {
            bit_buffer = byte_buffer[--byte_index];
            bit_buffer <<= 8 - bit_count;

            if (byte_index == 0) {
                fseek(file, -1-(int64_t) current_buffer_length, SEEK_CUR);
                load_buffer();
                bit_buffer = byte_buffer[byte_index++];
                bit_buffer <<= 8 - bit_count;
            }

            lim_skip(8 - rbits);
        }

    }
}